

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void check_throw_error<fmt::v5::system_error>(int error_code,FormatErrorMessage format)

{
  undefined8 uVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  memory_buffer message;
  system_error *e;
  system_error error;
  char *in_stack_fffffffffffffcc8;
  basic_string_view<char> *in_stack_fffffffffffffcd0;
  char (*in_stack_fffffffffffffd20) [6];
  int in_stack_fffffffffffffd2c;
  system_error *in_stack_fffffffffffffd30;
  string_view in_stack_fffffffffffffd38;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  fmt::v5::system_error::system_error<>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd38);
  uVar1 = __cxa_allocate_exception(0x18);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  fmt::v5::system_error::system_error<char[6]>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd20);
  __cxa_throw(uVar1,&fmt::v5::system_error::typeinfo,fmt::v5::system_error::~system_error);
}

Assistant:

void check_throw_error(int error_code, FormatErrorMessage format) {
  fmt::system_error error(0, "");
  try {
    throw Error(error_code, "test {}", "error");
  } catch (const fmt::system_error &e) {
    error = e;
  }
  fmt::memory_buffer message;
  format(message, error_code, "test error");
  EXPECT_EQ(to_string(message), error.what());
  EXPECT_EQ(error_code, error.error_code());
}